

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O1

VRle __thiscall VRle::opGeneric(VRle *this,VRle *o,Op op)

{
  model *pmVar1;
  model *pmVar2;
  pointer pSVar3;
  Data *this_00;
  vector<VRle::Span,_std::allocator<VRle::Span>_> *this_01;
  Op in_ECX;
  size_t __n;
  undefined4 in_register_00000014;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int __fd;
  Data *aObj;
  
  __n = (size_t)in_ECX;
  pmVar1 = (o->d).mModel;
  pmVar2 = *(model **)CONCAT44(in_register_00000014,op);
  if ((pmVar1->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pmVar1->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (this->d).mModel = pmVar2;
    LOCK();
    (pmVar2->mRef).super___atomic_base<unsigned_long>._M_i =
         (pmVar2->mRef).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  else if ((pmVar2->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
           _M_impl.super__Vector_impl_data._M_start ==
           (pmVar2->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
    (this->d).mModel = pmVar1;
    LOCK();
    (pmVar1->mRef).super___atomic_base<unsigned_long>._M_i =
         (pmVar1->mRef).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  else {
    this_00 = (Data *)__tls_get_addr(&PTR_00145f70);
    if (*(char *)&this_00[1].mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                  _M_impl.super__Vector_impl_data._M_start == '\0') {
      opGeneric();
    }
    pSVar3 = (this_00->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this_00->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
        super__Vector_impl_data._M_finish != pSVar3) {
      (this_00->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
      super__Vector_impl_data._M_finish = pSVar3;
    }
    *(undefined8 *)((long)&(this_00->mBbox).x1 + 1) = 0;
    *(undefined8 *)((long)&(this_00->mBbox).x2 + 1) = 0;
    (this_00->mOffset).mx = 0;
    (this_00->mOffset).my = 0;
    (this_00->mBbox).x1 = 0;
    (this_00->mBbox).y1 = 0;
    if (*(char *)&this_00[1].mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                  _M_impl.super__Vector_impl_data._M_start == '\0') {
      opGeneric();
    }
    aObj = &((o->d).mModel)->mValue;
    Data::opGeneric(this_00,aObj,(Data *)(*(long *)CONCAT44(in_register_00000014,op) + 8),in_ECX);
    __fd = (int)aObj;
    vcow_ptr<VRle::Data>::vcow_ptr(&this->d);
    __buf = extraout_RDX;
    if (*(char *)&this_00[1].mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                  _M_impl.super__Vector_impl_data._M_start == '\0') {
      opGeneric();
      __buf = extraout_RDX_00;
    }
    this_01 = (vector<VRle::Span,_std::allocator<VRle::Span>_> *)
              vcow_ptr<VRle::Data>::write(&this->d,__fd,__buf,__n);
    std::vector<VRle::Span,_std::allocator<VRle::Span>_>::operator=
              (this_01,(vector<VRle::Span,_std::allocator<VRle::Span>_> *)this_00);
    *(VPoint *)(this_01 + 1) = this_00->mOffset;
    pSVar3 = *(pointer *)&(this_00->mBbox).x2;
    this_01[1].super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
    super__Vector_impl_data._M_finish = *(pointer *)&this_00->mBbox;
    this_01[1].super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pSVar3;
    *(bool *)&this_01[2].super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
              super__Vector_impl_data._M_start = this_00->mBboxDirty;
  }
  return (VRle)(vcow_ptr<VRle::Data>)this;
}

Assistant:

VRle VRle::opGeneric(const VRle &o, Data::Op op) const
{
    if (empty()) return o;
    if (o.empty()) return *this;

    Scratch_Object.reset();
    Scratch_Object.opGeneric(d.read(), o.d.read(), op);

    VRle result;
    result.d.write() = Scratch_Object;

    return result;
}